

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sysinfo.cc
# Opt level: O2

char * GetenvBeforeMain(char *name)

{
  int iVar1;
  char *pcVar2;
  char *pcVar3;
  ulong uVar4;
  long lVar5;
  size_t in_RDX;
  size_t extraout_RDX;
  size_t n;
  size_t extraout_RDX_00;
  size_t extraout_RDX_01;
  char **p;
  undefined8 *puVar6;
  int iVar7;
  
  pcVar2 = slow_memchr(name,-1,in_RDX);
  iVar7 = (int)pcVar2 - (int)name;
  if (___environ == (undefined8 *)0x0) {
    n = extraout_RDX;
    if (GetenvBeforeMain::envbuf[0] == '\0') {
      uVar4 = syscall(2,"/proc/self/environ",0);
      if ((int)uVar4 == -1) {
        RAW_VLOG(1,
                 "Unable to open /proc/self/environ, falling back on getenv(\"%s\"), which may not work"
                 ,name);
LAB_00120927:
        pcVar2 = getenv(name);
        return pcVar2;
      }
      lVar5 = syscall(0,uVar4 & 0xffffffff,GetenvBeforeMain::envbuf,0x3ffe);
      if (lVar5 < 0) {
        RAW_VLOG(1,
                 "Unable to open /proc/self/environ, falling back on getenv(\"%s\"), which may not work"
                 ,name);
        syscall(3,uVar4 & 0xffffffff);
        goto LAB_00120927;
      }
      syscall(3,uVar4 & 0xffffffff);
      n = extraout_RDX_01;
    }
    pcVar2 = GetenvBeforeMain::envbuf;
    while( true ) {
      if ((*pcVar2 == '\0') ||
         (pcVar3 = slow_memchr(pcVar2,0x2dcd10 - (int)pcVar2,n), pcVar3 == (char *)0x0)) {
        return (char *)0x0;
      }
      iVar1 = slow_memcmp(pcVar2,name,(long)iVar7);
      if ((iVar1 == 0) && (pcVar2[iVar7] == '=')) break;
      pcVar2 = pcVar3 + 1;
      n = extraout_RDX_00;
    }
  }
  else {
    puVar6 = ___environ;
    while( true ) {
      pcVar2 = (char *)*puVar6;
      if (pcVar2 == (char *)0x0) {
        return (char *)0x0;
      }
      iVar1 = slow_memcmp(pcVar2,name,(long)iVar7);
      if ((iVar1 == 0) && (pcVar2[iVar7] == '=')) break;
      puVar6 = puVar6 + 1;
    }
  }
  return pcVar2 + (long)iVar7 + 1;
}

Assistant:

const char* GetenvBeforeMain(const char* name) {
  const int namelen = slow_strlen(name);
#if defined(HAVE___ENVIRON)   // if we have it, it's declared in unistd.h
  if (__environ) {            // can exist but be nullptr, if statically linked
    for (char** p = __environ; *p; p++) {
      if (!slow_memcmp(*p, name, namelen) && (*p)[namelen] == '=')
        return *p + namelen+1;
    }
    return nullptr;
  }
#endif
  // static is ok because this function should only be called before
  // main(), when we're single-threaded.
  static char envbuf[16<<10];
  if (*envbuf == '\0') {    // haven't read the environ yet
    int fd = safeopen("/proc/self/environ", O_RDONLY);
    // The -2 below guarantees the last two bytes of the buffer will be \0\0
    if (fd == -1 ||           // unable to open the file, fall back onto libc
        saferead(fd, envbuf, sizeof(envbuf) - 2) < 0) { // error reading file
      RAW_VLOG(1, "Unable to open /proc/self/environ, falling back "
               "on getenv(\"%s\"), which may not work", name);
      if (fd != -1) safeclose(fd);
      return getenv(name);
    }
    safeclose(fd);
  }
  const char* p = envbuf;
  while (*p != '\0') {    // will happen at the \0\0 that terminates the buffer
    // proc file has the format NAME=value\0NAME=value\0NAME=value\0...
    const char* endp = (char*)slow_memchr(p, '\0',
                                          sizeof(envbuf) - (p - envbuf));
    if (endp == nullptr)            // this entry isn't NUL terminated
      return nullptr;
    else if (!slow_memcmp(p, name, namelen) && p[namelen] == '=')    // it's a match
      return p + namelen+1;      // point after =
    p = endp + 1;
  }
  return nullptr;                   // env var never found
}